

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  pointer pPVar1;
  ITracker *pIVar2;
  int iVar3;
  TrackerContext *pTVar4;
  logic_error *this_00;
  
  pTVar4 = this->m_ctx;
  while ((TrackerBase *)pTVar4->m_currentTracker != this) {
    (*(((TrackerBase *)pTVar4->m_currentTracker)->super_ITracker).super_SharedImpl<Catch::IShared>.
      super_IShared.super_NonCopyable._vptr_NonCopyable[10])();
    pTVar4 = this->m_ctx;
  }
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Illogical state");
    break;
  case ExecutingChildren:
    pPVar1 = (this->m_children).
             super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((this->m_children).
         super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
         ._M_impl.super__Vector_impl_data._M_start != pPVar1) &&
       (iVar3 = (*((pPVar1[-1].m_p)->super_SharedImpl<Catch::IShared>).super_IShared.
                  super_NonCopyable._vptr_NonCopyable[5])(), (char)iVar3 == '\0'))
    goto switchD_00137f37_caseD_3;
  case Executing:
    this->m_runState = CompletedSuccessfully;
  case NeedsAnotherRun:
switchD_00137f37_caseD_3:
    pIVar2 = this->m_parent;
    if (pIVar2 == (ITracker *)0x0) {
      __assert_fail("m_parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/sutbult[P]redux-cpp/tests/catch.hpp"
                    ,0x1634,"void Catch::TestCaseTracking::TrackerBase::moveToParent()");
    }
    pTVar4 = this->m_ctx;
    pTVar4->m_currentTracker = pIVar2;
    pTVar4->m_runState = CompletedCycle;
    return (int)pIVar2;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unexpected state");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

virtual void close() CATCH_OVERRIDE {

            // Close any still open children (e.g. generators)
            while( &m_ctx.currentTracker() != this )
                m_ctx.currentTracker().close();

            switch( m_runState ) {
                case NotStarted:
                case CompletedSuccessfully:
                case Failed:
                    throw std::logic_error( "Illogical state" );

                case NeedsAnotherRun:
                    break;;

                case Executing:
                    m_runState = CompletedSuccessfully;
                    break;
                case ExecutingChildren:
                    if( m_children.empty() || m_children.back()->isComplete() )
                        m_runState = CompletedSuccessfully;
                    break;

                default:
                    throw std::logic_error( "Unexpected state" );
            }
            moveToParent();
            m_ctx.completeCycle();
        }